

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O3

vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *
DiffSectorCopies(vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
                 *__return_storage_ptr__,Sector *sector)

{
  pointer pDVar1;
  pointer puVar2;
  pointer pDVar3;
  int iVar4;
  int iVar5;
  DataList *pDVar6;
  Data *data;
  pointer pDVar7;
  pointer puVar8;
  pointer puVar9;
  pointer pDVar10;
  vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>> *this;
  pointer puVar11;
  iterator iVar12;
  pointer puVar13;
  pointer puVar14;
  pointer puVar15;
  int iVar16;
  pair<char,_unsigned_long> local_58;
  vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>> *local_48;
  pointer local_40;
  pointer local_38;
  
  iVar4 = Sector::copies(sector);
  if (iVar4 < 1) {
    __assert_fail("sector.copies() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/DiskUtil.cpp"
                  ,0x2a0,"std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector &)");
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>> *)
             __return_storage_ptr__;
  pDVar6 = Sector::datas(sector);
  pDVar10 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar6 = Sector::datas(sector);
  pDVar1 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pDVar7 = pDVar10 + 1;
  if (pDVar7 != pDVar1 && pDVar10 != pDVar1) {
    puVar15 = (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      puVar2 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pDVar3 = pDVar7;
      if (*(int *)&(pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar15 <=
          *(int *)&(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar2) {
        puVar2 = puVar15;
        pDVar3 = pDVar10;
      }
      pDVar10 = pDVar3;
      puVar15 = puVar2;
      pDVar7 = pDVar7 + 1;
    } while (pDVar7 != pDVar1);
  }
  puVar15 = (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this = local_48;
  if (puVar15 < local_40) {
    iVar4 = 0;
    local_38 = pDVar10;
    do {
      puVar2 = (local_38->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pDVar6 = Sector::datas(sector);
      puVar11 = local_40 + -(long)puVar15;
      pDVar7 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pDVar10 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pDVar7 != pDVar10) {
        do {
          if (puVar11 == (pointer)0x0) {
            puVar11 = (pointer)0x0;
          }
          else {
            puVar14 = (pointer)0x0;
            do {
              puVar9 = puVar14;
              if (puVar15[(long)puVar14] !=
                  puVar15[(long)(puVar14 +
                                ((long)(pDVar7->
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)puVar2))])
              break;
              puVar14 = puVar14 + 1;
              puVar9 = puVar11;
            } while (puVar11 != puVar14);
            if ((long)puVar9 < (long)puVar11) {
              puVar11 = puVar9;
            }
          }
          pDVar7 = pDVar7 + 1;
        } while (pDVar7 != pDVar10);
      }
      if (((long)puVar11 < 0x10) && ((puVar15 != puVar2 || ((long)puVar11 < 1)))) {
        iVar16 = (int)puVar11;
      }
      else {
        iVar12._M_current = *(pair<char,_unsigned_long> **)(this + 8);
        if (iVar4 != 0) {
          local_58.first = '-';
          local_58.second = (unsigned_long)iVar4;
          if (iVar12._M_current == *(pair<char,_unsigned_long> **)(this + 0x10)) {
            std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
            ::_M_realloc_insert<std::pair<char,unsigned_long>>(this,iVar12,&local_58);
            iVar12._M_current = *(pair<char,_unsigned_long> **)(this + 8);
          }
          else {
            *(ulong *)iVar12._M_current = CONCAT71(local_58._1_7_,0x2d);
            (iVar12._M_current)->second = local_58.second;
            iVar12._M_current = (pair<char,_unsigned_long> *)(*(long *)(this + 8) + 0x10);
            *(pair<char,_unsigned_long> **)(this + 8) = iVar12._M_current;
          }
        }
        local_58.first = '=';
        local_58.second = (unsigned_long)puVar11;
        if (iVar12._M_current == *(pair<char,_unsigned_long> **)(this + 0x10)) {
          std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
          _M_realloc_insert<std::pair<char,unsigned_long>>(this,iVar12,&local_58);
        }
        else {
          *(ulong *)iVar12._M_current = CONCAT71(local_58._1_7_,0x3d);
          (iVar12._M_current)->second = (unsigned_long)puVar11;
          *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
        }
        iVar16 = 0;
        iVar4 = 0;
      }
      puVar15 = puVar15 + (long)puVar11;
      puVar2 = (local_38->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pDVar6 = Sector::datas(sector);
      this = local_48;
      puVar11 = local_40 + -(long)puVar15;
      for (pDVar7 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pDVar7 != (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
                    super__Vector_impl_data._M_finish; pDVar7 = pDVar7 + 1) {
        if (puVar11 == (pointer)0x0) {
          puVar14 = (pointer)0x0;
        }
        else {
          puVar13 = puVar15 + ((long)(pDVar7->
                                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)puVar2);
          puVar9 = puVar13;
          if (puVar13 != puVar13 + (long)(puVar11 + -1)) {
            puVar14 = puVar11 + -1;
            puVar8 = puVar13;
            do {
              puVar9 = puVar8;
              if (*puVar13 != puVar8[1]) break;
              puVar8 = puVar8 + 1;
              puVar14 = puVar14 + -1;
              puVar9 = puVar13 + (long)(puVar11 + -1);
            } while (puVar14 != (pointer)0x0);
          }
          puVar14 = puVar9 + (1 - (long)puVar13);
          if ((long)puVar11 <= (long)(puVar9 + (1 - (long)puVar13))) {
            puVar14 = puVar11;
          }
        }
        puVar11 = puVar14;
      }
      if ((long)puVar11 < 0x10) {
        iVar5 = (int)puVar11;
      }
      else {
        iVar12._M_current = *(pair<char,_unsigned_long> **)(local_48 + 8);
        if (iVar4 != 0) {
          local_58.first = '-';
          local_58.second = (unsigned_long)iVar4;
          if (iVar12._M_current == *(pair<char,_unsigned_long> **)(local_48 + 0x10)) {
            std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
            ::_M_realloc_insert<std::pair<char,unsigned_long>>(local_48,iVar12,&local_58);
            iVar12._M_current = *(pair<char,_unsigned_long> **)(this + 8);
          }
          else {
            *(ulong *)iVar12._M_current = CONCAT71(local_58._1_7_,0x2d);
            (iVar12._M_current)->second = local_58.second;
            iVar12._M_current = (pair<char,_unsigned_long> *)(*(long *)(local_48 + 8) + 0x10);
            *(pair<char,_unsigned_long> **)(local_48 + 8) = iVar12._M_current;
          }
        }
        local_58.first = '+';
        local_58.second = (unsigned_long)puVar11;
        if (iVar12._M_current == *(pair<char,_unsigned_long> **)(this + 0x10)) {
          std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
          _M_realloc_insert<std::pair<char,unsigned_long>>(this,iVar12,&local_58);
        }
        else {
          *(ulong *)iVar12._M_current = CONCAT71(local_58._1_7_,0x2b);
          (iVar12._M_current)->second = (unsigned_long)puVar11;
          *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
        }
        iVar5 = 0;
        iVar4 = 0;
      }
      puVar15 = puVar15 + (long)puVar11;
      iVar4 = iVar16 + iVar4 + iVar5;
    } while (puVar15 < local_40);
    if (iVar4 != 0) {
      local_58.first = '-';
      local_58.second = (unsigned_long)iVar4;
      iVar12._M_current = *(pair<char,_unsigned_long> **)(this + 8);
      if (iVar12._M_current == *(pair<char,_unsigned_long> **)(this + 0x10)) {
        std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
        _M_realloc_insert<std::pair<char,unsigned_long>>(this,iVar12,&local_58);
      }
      else {
        *(ulong *)iVar12._M_current = CONCAT71(local_58._1_7_,0x2d);
        (iVar12._M_current)->second = local_58.second;
        *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
      }
    }
  }
  return (vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *
         )this;
}

Assistant:

std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector& sector)
{
    assert(sector.copies() > 0);
    std::vector<std::pair<char, size_t>> diffs;

    auto& smallest = *std::min_element(
        sector.datas().begin(), sector.datas().end(),
        [](const Data& d1, const Data& d2) {
            return d1.size() < d2.size();
        }
    );
    auto it = smallest.begin();
    auto itEnd = smallest.end();

    //  int extent = pt_->GetDataExtent(nSector_);  // ToDo
    auto change_count = 0;

    auto diff = 0;
    while (it < itEnd)
    {
        auto offset = std::distance(smallest.begin(), it);
        auto same = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (same)
            {
                // Find the prefix length where all data copies match
                auto pair = std::mismatch(it, it + same, data.begin() + offset);
                auto offset2 = std::distance(it, pair.first);
                same = std::min(same, offset2);
            }
        }
        it = it + same;

        // Show the matching block if big enough or if found
        // at the start of the data field. Other fragments will
        // be added to the diff block.
        if (same >= MIN_DIFF_BLOCK || (offset == 0 && same > 0))
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('=', same));
            same = 0;
        }

        offset = std::distance(smallest.begin(), it);
        auto match = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (match)
            {
                // Find the prefix length where each copy has matching filler
                auto pair = std::mismatch(data.begin() + offset, data.begin() + offset + match - 1, data.begin() + offset + 1);
                auto offset2 = 1 + std::distance(data.begin() + offset, pair.first);
                match = std::min(match, offset2);
            }
        }
        it = it + match;

        // Show the filler block if big enough. Filler has matching
        // bytes in each copy, but a different value across copies.
        if (match >= MIN_DIFF_BLOCK)
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('+', match));
            match = 0;
        }

        diff += static_cast<int>(same + match);
    }

    if (diff)
    {
        ++change_count;
        diffs.push_back(std::make_pair('-', diff));
    }

    return diffs;
}